

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_helpers.cc
# Opt level: O2

bool __thiscall
google::protobuf::compiler::objectivec::anon_unknown_0::Parser::ParseLoop(Parser *this)

{
  bool bVar1;
  int iVar2;
  StringPiece line;
  StringPiece local_38;
  
  local_38.ptr_ = (char *)0x0;
  local_38.length_ = 0;
  do {
    do {
      bVar1 = ReadLine(&this->p_,&local_38);
      if (!bVar1) goto LAB_002626e0;
      this->line_ = this->line_ + 1;
      RemoveComment(&local_38);
      StringPieceTrimWhitespace(&local_38);
    } while (local_38.length_ == 0);
    iVar2 = (*this->line_consumer_->_vptr_LineConsumer[2])
                      (this->line_consumer_,&local_38,&this->error_str_);
  } while ((char)iVar2 != '\0');
LAB_002626e0:
  return !bVar1;
}

Assistant:

bool Parser::ParseLoop() {
  StringPiece line;
  while (ReadLine(&p_, &line)) {
    ++line_;
    RemoveComment(&line);
    StringPieceTrimWhitespace(&line);
    if (line.size() == 0) {
      continue;  // Blank line.
    }
    if (!line_consumer_->ConsumeLine(line, &error_str_)) {
      return false;
    }
  }
  return true;
}